

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::onTimeSyncSendTimer(Connection *this)

{
  long in_RDI;
  ReceiverStatistics RVar1;
  Result result;
  ReceiverStatistics stats;
  uint8_t buffer [11];
  TimeSynchronizer *in_stack_ffffffffffffff38;
  Result *in_stack_ffffffffffffff40;
  SessionIncoming *in_stack_ffffffffffffff48;
  ReceiverBandwidthControl *this_00;
  MessageType messageType;
  SessionOutgoing *this_01;
  Result *in_stack_ffffffffffffff78;
  float reason;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff8c;
  ReceiverStatistics local_6c;
  undefined1 local_60 [11];
  uint8_t auStack_55 [13];
  undefined1 *local_48;
  uint local_3c;
  SessionOutgoing *local_38;
  uint32_t local_2c;
  undefined1 *local_28;
  ReceiverBandwidthControl *local_20;
  undefined1 *local_18;
  ErrorResult *local_10;
  undefined1 *local_8;
  
  local_2c = SessionIncoming::GetNextExpectedNonce24(in_stack_ffffffffffffff48);
  local_28 = local_60 + 5;
  this_01 = (SessionOutgoing *)(local_60 + 8);
  this_00 = (ReceiverBandwidthControl *)local_60;
  local_60._5_4_ = local_2c;
  TimeSynchronizer::GetMinDeltaTS24(in_stack_ffffffffffffff38);
  local_3c = *(uint *)&(this_00->Deps).TimeSync;
  local_38 = this_01;
  local_20 = this_00;
  *(uint *)&(this_01->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = local_3c;
  RVar1 = ReceiverBandwidthControl::GetStatistics(this_00);
  messageType = (MessageType)((ulong)this_00 >> 0x20);
  reason = RVar1.LossRate;
  uVar2 = RVar1.TripUsec;
  local_6c._0_8_ = RVar1._0_8_;
  local_6c.TripUsec = uVar2;
  ReceiverStatistics::Compress(&local_6c,local_60 + 0xb);
  SessionOutgoing::QueueUnreliable
            (this_01,messageType,(uint8_t *)in_stack_ffffffffffffff48,
             (size_t)in_stack_ffffffffffffff40);
  local_48 = &stack0xffffffffffffff78;
  if (in_stack_ffffffffffffff78 != (Result *)0x0) {
    in_stack_ffffffffffffff40 = (Result *)(in_RDI + 8);
    local_18 = &stack0xffffffffffffff78;
    if (in_stack_ffffffffffffff78 == (Result *)0x0) {
      local_10 = (ErrorResult *)0x0;
    }
    else {
      local_10 = in_stack_ffffffffffffff78[6].Error;
    }
    local_8 = local_18;
    RefCounter::StartShutdown
              ((RefCounter *)CONCAT44(in_stack_ffffffffffffff8c,uVar2),(uint)reason,
               in_stack_ffffffffffffff78);
  }
  Result::~Result(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void Connection::onTimeSyncSendTimer()
{
    uint8_t buffer[kTimeSyncMessageBytes];

    // Write next expected nonce
    siamese::WriteU24_LE_Min4Bytes(buffer, Incoming.GetNextExpectedNonce24());

    // Write MinDeltaTS24
    siamese::WriteU24_LE_Min4Bytes(buffer + 3, TimeSync.GetMinDeltaTS24().ToUnsigned());

    // Write ReceiverStatistics
    const ReceiverStatistics stats = ReceiverControl.GetStatistics();
    stats.Compress(buffer + 3 + 3);

    Result result = Outgoing.QueueUnreliable(
        protocol::MessageType_TimeSync,
        buffer,
        kTimeSyncMessageBytes);

    if (result.IsFail()) {
        SelfRefCount.StartShutdown((unsigned)result.GetErrorCode(), result);
    }
}